

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

char * __thiscall sqvector<char>::push_back(sqvector<char> *this,char *val)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = this->_size;
  if (this->_allocated <= uVar2) {
    _realloc(this,uVar2 * 2);
    uVar2 = this->_size;
  }
  pcVar1 = this->_vals;
  this->_size = uVar2 + 1;
  pcVar1[uVar2] = *val;
  return pcVar1 + uVar2;
}

Assistant:

inline T &push_back(const T& val = T())
    {
        if(_allocated <= _size)
            _realloc(_size * 2);
        return *(new ((void *)&_vals[_size++]) T(val));
    }